

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqliteBuiltin_db_update_record(jx9_context *pCtx,int argc,jx9_value **argv)

{
  SyBlob *pBlob;
  uint uVar1;
  jx9_value *pArray;
  unqlite_kv_engine *puVar2;
  unqlite_kv_methods *puVar3;
  void *pvVar4;
  int iVar5;
  sxi32 sVar6;
  unqlite_col *pCol;
  jx9_int64 iVal;
  int iFlag;
  char *pcVar7;
  uint iBool;
  unqlite *pDb;
  int nByte;
  SyString sName;
  jx9_value local_70;
  
  if (argc < 2) {
    pcVar7 = "Missing collection name and/or records";
LAB_00116beb:
    jx9_context_throw_error(pCtx,1,pcVar7);
  }
  else {
    pcVar7 = jx9_value_to_string(*argv,&nByte);
    if (nByte < 1) {
      pcVar7 = "Invalid collection name";
      goto LAB_00116beb;
    }
    sName.nByte = nByte;
    sName.zString = pcVar7;
    pCol = unqliteCollectionFetch((unqlite_vm *)pCtx->pFunc->pUserData,&sName,iFlag);
    if (pCol != (unqlite_col *)0x0) {
      iVal = jx9_value_to_int64(argv[1]);
      pArray = argv[2];
      if (((pArray->iFlags & 0x40) != 0) && ((*(byte *)((pArray->x).iVal + 0x40) & 1) == 0)) {
        iVar5 = jx9_array_walk(pArray,CollectionRecordArrayWalker,pCol);
        iBool = (uint)(iVar5 == 0);
        goto LAB_00116bfb;
      }
      pDb = pCol->pVm->pDb;
      if (pCol->nTotRec == 0x7fffffffffffffff) {
        pcVar7 = "Collection \'%z\': Records limit reached";
      }
      else {
        puVar2 = ((pDb->sDB).pPager)->pEngine;
        puVar3 = puVar2->pIo->pMethods;
        if (puVar3->xReplace ==
            (_func_int_unqlite_kv_engine_ptr_void_ptr_int_void_ptr_unqlite_int64 *)0x0) {
          pcVar7 = 
          "Cannot store record into collection \'%z\' due to a read-only Key/Value storage engine";
        }
        else {
          pBlob = &pCol->sWorker;
          SyBlobReset(pBlob);
          SyBlobFormat(pBlob,"%z_%qd",&pCol->sName,iVal);
          unqlite_kv_cursor_reset(pCol->pCursor);
          iVar5 = unqlite_kv_cursor_seek
                            (pCol->pCursor,(pCol->sWorker).pBlob,(pCol->sWorker).nByte,1);
          if (iVar5 != 0) {
            unqliteGenErrorFormat
                      (pCol->pVm->pDb,"No record to update in collection \'%z\'",&pCol->sName);
            iBool = 0;
            goto LAB_00116bfb;
          }
          if (((pArray->iFlags & 0x40) != 0) && ((*(byte *)((pArray->x).iVal + 0x40) & 1) != 0)) {
            jx9MemObjInitFromInt(pCol->pVm->pJx9Vm,&local_70,iVal);
            jx9_array_add_strkey_elem(pArray,"__id",&local_70);
            jx9MemObjRelease(&local_70);
          }
          uVar1 = (pCol->sWorker).nByte;
          iBool = 0;
          if ((ulong)uVar1 == 0) {
            unqliteGenOutofMem(pCol->pVm->pDb);
            goto LAB_00116bfb;
          }
          sVar6 = FastJsonEncode(pArray,pBlob,0);
          iBool = 0;
          if (sVar6 != 0) goto LAB_00116bfb;
          pvVar4 = (pCol->sWorker).pBlob;
          iVar5 = (*puVar3->xReplace)(puVar2,pvVar4,uVar1,(void *)((ulong)uVar1 + (long)pvVar4),
                                      (long)(pCol->sWorker).nByte + (long)uVar1 * 0xffffffff);
          if (iVar5 == 0) {
            CollectionCacheInstallRecord(pCol,iVal,pArray);
            iBool = 1;
            goto LAB_00116bfb;
          }
          pDb = pCol->pVm->pDb;
          pcVar7 = "IO error while storing record into collection \'%z\'";
        }
      }
      unqliteGenErrorFormat(pDb,pcVar7,&pCol->sName);
      iBool = 0;
      goto LAB_00116bfb;
    }
    jx9_context_throw_error_format(pCtx,1,"No such collection \'%z\'",&sName);
  }
  iBool = 0;
LAB_00116bfb:
  jx9_result_bool(pCtx,iBool);
  return 0;
}

Assistant:

static int unqliteBuiltin_db_update_record(jx9_context *pCtx,int argc,jx9_value **argv)
{
    unqlite_col *pCol;
    const char *zName;
    unqlite_vm *pVm;
    SyString sName;
    jx9_int64 nId;
    int nByte;
    int rc;
    /* Extract collection name */
    if( argc < 2 ){
        /* Missing arguments */
        jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name and/or records");
        /* Return false */
        jx9_result_bool(pCtx,0);
        return JX9_OK;
    }
    zName = jx9_value_to_string(argv[0],&nByte);
    if( nByte < 1){
        jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
        /* Return false */
        jx9_result_bool(pCtx,0);
        return JX9_OK;
    }
    SyStringInitFromBuf(&sName,zName,nByte);
    pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
    /* Fetch the collection */
    pCol = unqliteCollectionFetch(pVm,&sName,UNQLITE_VM_AUTO_LOAD);
    if( pCol == 0 ){
        jx9_context_throw_error_format(pCtx,JX9_CTX_ERR,"No such collection '%z'",&sName);
        /* Return false */
        jx9_result_bool(pCtx,0);
        return JX9_OK;
    }
    /* Update a record with the given value */
    nId = jx9_value_to_int64(argv[1]);
    rc = unqliteCollectionUpdateRecord(pCol, nId, argv[2], 0);
    /* All done, return TRUE */
    jx9_result_bool(pCtx,rc == UNQLITE_OK);
    return JX9_OK;
}